

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderAlgorithmTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ShaderAlgorithmCase::ShaderAlgorithmCase
          (ShaderAlgorithmCase *this,Context *context,char *name,char *description,bool isVertexCase
          ,ShaderEvalFunc evalFunc,char *vertShaderSource,char *fragShaderSource)

{
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,description,isVertexCase,evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAlgorithmCase_00718cb0;
  std::__cxx11::string::assign((char *)&(this->super_ShaderRenderCase).m_vertShaderSource);
  std::__cxx11::string::assign((char *)&(this->super_ShaderRenderCase).m_fragShaderSource);
  return;
}

Assistant:

ShaderAlgorithmCase::ShaderAlgorithmCase (Context& context, const char* name, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, const char* vertShaderSource, const char* fragShaderSource)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
{
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}